

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.cpp
# Opt level: O3

double phyr::scrambledRadicalInverseSpecialized<2389>(uint16_t *perm,uint64_t a)

{
  bool bVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  if (a == 0) {
    dVar4 = 0.0;
    dVar3 = 1.0;
  }
  else {
    dVar3 = 1.0;
    lVar2 = 0;
    do {
      lVar2 = (ulong)perm[a % 0x955] + lVar2 * 0x955;
      dVar3 = dVar3 * 0.0004185851820845542;
      bVar1 = 0x954 < a;
      a = a / 0x955;
    } while (bVar1);
    auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = 0x45300000;
    dVar4 = (auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
  }
  dVar3 = (((double)*perm * 0.0004185851820845542) / 0.9995814148179154 + dVar4) * dVar3;
  dVar4 = 0.9999999999999999;
  if (dVar3 <= 0.9999999999999999) {
    dVar4 = dVar3;
  }
  return dVar4;
}

Assistant:

static Real scrambledRadicalInverseSpecialized(const uint16_t* perm, uint64_t a) {
    const Real invBase = (Real)1 / (Real)base;
    uint64_t reversedDigits = 0;
    Real invBaseN = 1;

    while (a) {
        uint64_t next = a / base;
        uint64_t digit = a - next * base;
        ASSERT(perm[digit] < base);
        reversedDigits = reversedDigits * base + perm[digit];
        invBaseN *= invBase;
        a = next;
    }
    ASSERT(invBaseN * (reversedDigits + invBase * perm[0] / (1 - invBase)) < 1.00001);
    return std::min(
        invBaseN * (reversedDigits + invBase * perm[0] / (1 - invBase)),
        OneMinusEpsilon);
}